

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void el::Loggers::setDefaultConfigurations
               (Configurations *configurations,bool reconfigureExistingLoggers)

{
  long *plVar1;
  undefined7 in_register_00000031;
  
  plVar1 = *(long **)(base::elStorage + 0x10);
  (**(code **)(*plVar1 + 0x10))(plVar1);
  Configurations::setFromBase((Configurations *)(plVar1 + 0xb),configurations);
  if ((int)CONCAT71(in_register_00000031,reconfigureExistingLoggers) != 0) {
    reconfigureAllLoggers(configurations);
    return;
  }
  return;
}

Assistant:

void Loggers::setDefaultConfigurations(const Configurations& configurations, bool reconfigureExistingLoggers) {
  ELPP->registeredLoggers()->setDefaultConfigurations(configurations);
  if (reconfigureExistingLoggers) {
    Loggers::reconfigureAllLoggers(configurations);
  }
}